

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.cpp
# Opt level: O1

int kmp_set_thread_affinity_mask_initial(void)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  
  iVar1 = __kmp_get_global_thread_id();
  if (((-1 < iVar1) && (__kmp_affin_mask_size != 0)) && (__kmp_init_middle != 0)) {
    iVar1 = (*__kmp_affin_fullMask->_vptr_Mask[0xd])(__kmp_affin_fullMask,0,extraout_RDX,in_RAX);
    return iVar1;
  }
  return -1;
}

Assistant:

int
    kmp_set_thread_affinity_mask_initial()
// the function returns 0 on success,
//   -1 if we cannot bind thread
//   >0 (errno) if an error happened during binding
{
  int gtid = __kmp_get_gtid();
  if (gtid < 0) {
    // Do not touch non-omp threads
    KA_TRACE(30, ("kmp_set_thread_affinity_mask_initial: "
                  "non-omp thread, returning\n"));
    return -1;
  }
  if (!KMP_AFFINITY_CAPABLE() || !__kmp_init_middle) {
    KA_TRACE(30, ("kmp_set_thread_affinity_mask_initial: "
                  "affinity not initialized, returning\n"));
    return -1;
  }
  KA_TRACE(30, ("kmp_set_thread_affinity_mask_initial: "
                "set full mask for thread %d\n",
                gtid));
  KMP_DEBUG_ASSERT(__kmp_affin_fullMask != NULL);
  return __kmp_set_system_affinity(__kmp_affin_fullMask, FALSE);
}